

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDebugOperationWithDeref(DebugInfoManager *this)

{
  IRContext *pIVar1;
  uint32_t res_id;
  uint32_t uVar2;
  PodType PVar3;
  FeatureManager *pFVar4;
  Instruction *pIVar5;
  pointer *__ptr_1;
  long lVar6;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *pdVar7;
  size_type __dnew;
  string message;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_168;
  array<signed_char,_4UL> local_15c;
  undefined1 local_158 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_138;
  undefined1 local_128 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_108;
  undefined1 local_100 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_e0;
  size_t *local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  undefined4 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined4 local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pIVar5 = this->deref_operation_;
  if (pIVar5 == (Instruction *)0x0) {
    pIVar1 = this->context_;
    res_id = Module::TakeNextIdBound
                       ((pIVar1->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)
       ) {
      local_158._0_8_ = (_func_int **)0x25;
      local_d8 = &local_d0.size_;
      local_d8 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)local_158);
      local_d0.size_ = local_158._0_8_;
      *local_d8 = 0x667265766f204449;
      local_d8[1] = 0x797254202e776f6c;
      local_d8[2] = 0x676e696e6e757220;
      local_d8[3] = 0x746361706d6f6320;
      builtin_strncpy((char *)((long)local_d8 + 0x1d),"act-ids.",8);
      local_d0._vptr_SmallVector = (_func_int **)local_158._0_8_;
      *(char *)((long)local_d8 + local_158._0_8_) = '\0';
      local_158._0_8_ = (_func_int **)0x0;
      local_158._8_8_ = 0;
      local_158._16_4_ = (array<signed_char,_4UL>)0x0;
      local_158._20_4_ = (array<signed_char,_4UL>)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_158,(char *)local_d8)
      ;
      if (local_d8 != &local_d0.size_) {
        operator_delete(local_d8,local_d0.size_ + 1);
      }
    }
    pIVar1 = this->context_;
    pFVar4 = (pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar4 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
      pFVar4 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    if (pFVar4->extinst_importid_OpenCL100DebugInfo_ == 0) {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
        IRContext::BuildConstantManager(pIVar1);
      }
      local_15c._M_elems =
           (_Type)ConstantManager::GetUIntConstId
                            ((pIVar1->constant_mgr_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                             .
                             super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>
                             ._M_head_impl,0);
      pIVar5 = (Instruction *)operator_new(0x70);
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(pIVar1);
      }
      uVar2 = TypeManager::GetVoidTypeId
                        ((pIVar1->type_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                         _M_head_impl);
      PVar3.data._M_elems = (array<signed_char,_4UL>)GetDbgSetImportId(this);
      local_158._24_8_ = local_158 + 0x10;
      local_158._0_8_ = &PTR__SmallVector_00930a20;
      local_138._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_158._16_4_ = PVar3.data._M_elems;
      local_158._8_8_ = 1;
      local_d8 = (size_t *)CONCAT44(local_d8._4_4_,1);
      local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
      local_d0.size_ = 0;
      local_d0.small_data_ = (uint *)local_d0.buffer;
      local_d0.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_158);
      local_100._24_8_ = local_100 + 0x10;
      local_100._0_8_ = &PTR__SmallVector_00930a20;
      local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_100[0x10] = '\x1e';
      local_100[0x11] = '\0';
      local_100[0x12] = '\0';
      local_100[0x13] = '\0';
      local_100._8_8_ = 1;
      local_a8 = 7;
      local_a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
      local_a0.size_ = 0;
      local_a0.small_data_ = (uint *)local_a0.buffer;
      local_a0.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_a0,(SmallVector<unsigned_int,_2UL> *)local_100);
      local_128._24_8_ = local_128 + 0x10;
      local_128._0_8_ = &PTR__SmallVector_00930a20;
      local_108._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_128[0x10] = local_15c._M_elems[0];
      local_128[0x11] = local_15c._M_elems[1];
      local_128[0x12] = local_15c._M_elems[2];
      local_128[0x13] = local_15c._M_elems[3];
      local_128._8_8_ = 1;
      local_78 = 1;
      local_70._0_8_ = &PTR__SmallVector_00930a20;
      local_70._8_8_ = 0;
      local_70._24_8_ = local_70 + 0x10;
      pdVar7 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50;
      local_50._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_70,
                 (SmallVector<unsigned_int,_2UL> *)local_128);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 &local_d8,&local_48);
      Instruction::Instruction(pIVar5,pIVar1,OpExtInst,uVar2,res_id,(OperandList *)&local_48);
      local_168._M_head_impl = pIVar5;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_48);
      lVar6 = -0x90;
      do {
        *(undefined ***)(pdVar7 + -0x20) = &PTR__SmallVector_00930a20;
        if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar7 !=
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    (pdVar7,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar7);
        }
        *(undefined8 *)pdVar7 = 0;
        pdVar7 = pdVar7 + -0x30;
        lVar6 = lVar6 + 0x30;
      } while (lVar6 != 0);
      local_128._0_8_ = &PTR__SmallVector_00930a20;
      if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
          local_108._M_head_impl !=
          (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_108,local_108._M_head_impl);
      }
      local_100._0_8_ = &PTR__SmallVector_00930a20;
      if (local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_e0,local_e0._M_head_impl);
      }
    }
    else {
      pIVar5 = (Instruction *)operator_new(0x70);
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(pIVar1);
      }
      uVar2 = TypeManager::GetVoidTypeId
                        ((pIVar1->type_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                         _M_head_impl);
      PVar3.data._M_elems = (array<signed_char,_4UL>)GetDbgSetImportId(this);
      local_158._24_8_ = local_158 + 0x10;
      local_158._0_8_ = &PTR__SmallVector_00930a20;
      local_138._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_158._16_4_ = PVar3.data._M_elems;
      local_158._8_8_ = 1;
      local_d8 = (size_t *)CONCAT44(local_d8._4_4_,1);
      local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
      local_d0.size_ = 0;
      local_d0.small_data_ = (uint *)local_d0.buffer;
      local_d0.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_158);
      local_100._24_8_ = local_100 + 0x10;
      local_100._0_8_ = &PTR__SmallVector_00930a20;
      local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_100[0x10] = '\x1e';
      local_100[0x11] = '\0';
      local_100[0x12] = '\0';
      local_100[0x13] = '\0';
      local_100._8_8_ = 1;
      local_a8 = 7;
      local_a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
      local_a0.size_ = 0;
      local_a0.small_data_ = (uint *)local_a0.buffer;
      local_a0.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_a0,(SmallVector<unsigned_int,_2UL> *)local_100);
      local_128._24_8_ = local_128 + 0x10;
      local_128._0_8_ = &PTR__SmallVector_00930a20;
      local_108._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128._8_8_ = 1;
      local_78 = 0x41;
      local_70._0_8_ = &PTR__SmallVector_00930a20;
      local_70._8_8_ = 0;
      local_70._24_8_ = local_70 + 0x10;
      pdVar7 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50;
      local_50._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_70,
                 (SmallVector<unsigned_int,_2UL> *)local_128);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 &local_d8,&local_48);
      Instruction::Instruction(pIVar5,pIVar1,OpExtInst,uVar2,res_id,(OperandList *)&local_48);
      local_168._M_head_impl = pIVar5;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_48);
      lVar6 = -0x90;
      do {
        *(undefined ***)(pdVar7 + -0x20) = &PTR__SmallVector_00930a20;
        if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar7 !=
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    (pdVar7,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar7);
        }
        *(undefined8 *)pdVar7 = 0;
        pdVar7 = pdVar7 + -0x30;
        lVar6 = lVar6 + 0x30;
      } while (lVar6 != 0);
      local_128._0_8_ = &PTR__SmallVector_00930a20;
      if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
          local_108._M_head_impl !=
          (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_108,local_108._M_head_impl);
      }
      local_100._0_8_ = &PTR__SmallVector_00930a20;
      if (local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_e0,local_e0._M_head_impl);
      }
    }
    local_158._0_8_ = &PTR__SmallVector_00930a20;
    if (local_138._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_138,local_138._M_head_impl);
    }
    pIVar5 = Instruction::InsertBefore
                       ((((this->context_->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                        sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
                        (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_168);
    this->deref_operation_ = pIVar5;
    RegisterDbgInst(this,pIVar5);
    if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      DefUseManager::AnalyzeInstDefUse
                ((this->context_->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,this->deref_operation_);
    }
    pIVar5 = this->deref_operation_;
    if (local_168._M_head_impl != (Instruction *)0x0) {
      (*((local_168._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  return pIVar5;
}

Assistant:

Instruction* DebugInfoManager::GetDebugOperationWithDeref() {
  if (deref_operation_ != nullptr) return deref_operation_;

  uint32_t result_id = context()->TakeNextId();
  std::unique_ptr<Instruction> deref_operation;

  if (context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    deref_operation = std::unique_ptr<Instruction>(new Instruction(
        context(), spv::Op::OpExtInst,
        context()->get_type_mgr()->GetVoidTypeId(), result_id,
        {
            {SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
            {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
             {static_cast<uint32_t>(OpenCLDebugInfo100DebugOperation)}},
            {SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION,
             {static_cast<uint32_t>(OpenCLDebugInfo100Deref)}},
        }));
  } else {
    uint32_t deref_id = context()->get_constant_mgr()->GetUIntConstId(
        NonSemanticShaderDebugInfo100Deref);

    deref_operation = std::unique_ptr<Instruction>(
        new Instruction(context(), spv::Op::OpExtInst,
                        context()->get_type_mgr()->GetVoidTypeId(), result_id,
                        {
                            {SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
                            {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                             {static_cast<uint32_t>(
                                 NonSemanticShaderDebugInfo100DebugOperation)}},
                            {SPV_OPERAND_TYPE_ID, {deref_id}},
                        }));
  }

  // Add to the front of |ext_inst_debuginfo_|.
  deref_operation_ =
      context()->module()->ext_inst_debuginfo_begin()->InsertBefore(
          std::move(deref_operation));

  RegisterDbgInst(deref_operation_);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(deref_operation_);
  return deref_operation_;
}